

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

void __thiscall Tigre::String::String(String *this,int i)

{
  string local_38;
  int local_14;
  String *pSStack_10;
  int i_local;
  String *this_local;
  
  local_14 = i;
  pSStack_10 = this;
  std::__cxx11::string::string((string *)this);
  std::__cxx11::to_string(&local_38,local_14);
  std::__cxx11::string::operator=((string *)this,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

Tigre::String::String(int i){
    this->value = std::to_string(i);
}